

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

void __thiscall
FThinkerIterator::FThinkerIterator(FThinkerIterator *this,PClass *type,int statnum,DThinker *prev)

{
  int iVar1;
  DThinker *pDVar2;
  
  iVar1 = 0x20;
  if ((uint)statnum < 0x80) {
    iVar1 = statnum;
  }
  this->m_Stat = (BYTE)iVar1;
  this->m_SearchStats = 0x7f < (uint)statnum;
  this->m_ParentType = type;
  if ((prev == (DThinker *)0x0) ||
     (pDVar2 = prev->NextThinker, ((pDVar2->super_DObject).ObjectFlags & 0x400) != 0)) {
    pDVar2 = FThinkerList::GetHead(DThinker::Thinkers + this->m_Stat);
  }
  this->m_CurrThinker = pDVar2;
  this->m_SearchingFresh = false;
  return;
}

Assistant:

FThinkerIterator::FThinkerIterator (const PClass *type, int statnum, DThinker *prev)
{
	if ((unsigned)statnum > MAX_STATNUM)
	{
		m_Stat = STAT_FIRST_THINKING;
		m_SearchStats = true;
	}
	else
	{
		m_Stat = statnum;
		m_SearchStats = false;
	}
	m_ParentType = type;
	if (prev == NULL || (prev->NextThinker->ObjectFlags & OF_Sentinel))
	{
		Reinit();
	}
	else
	{
		m_CurrThinker = prev->NextThinker;
		m_SearchingFresh = false;
	}
}